

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O0

char * __thiscall ImportEntryWrapper::getLibraryName(ImportEntryWrapper *this)

{
  Executable *pEVar1;
  bufsize_t bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bufsize_t bVar5;
  bufsize_t local_68;
  size_t limit;
  bufsize_t HARD_LIMIT;
  bufsize_t upperLimit;
  offset_t peSize;
  char *name;
  offset_t nAddr;
  offset_t nameRVA;
  IMAGE_IMPORT_DESCRIPTOR *desc;
  ImportEntryWrapper *this_local;
  
  iVar4 = (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  if (CONCAT44(extraout_var,iVar4) == 0) {
    this_local = (ImportEntryWrapper *)0x0;
  }
  else {
    pEVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar4 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x18])
                      (pEVar1,(ulong)*(uint *)(CONCAT44(extraout_var,iVar4) + 0xc),2,0);
    if (CONCAT44(extraout_var_00,iVar4) == -1) {
      this_local = (ImportEntryWrapper *)0x0;
    }
    else {
      pEVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar4 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[7])
                        (pEVar1,CONCAT44(extraout_var_00,iVar4),1,0);
      this_local = (ImportEntryWrapper *)CONCAT44(extraout_var_01,iVar4);
      (*(((this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
          super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xd])()
      ;
      bVar5 = AbstractByteBuffer::getMaxSizeFromPtr
                        (&((this->super_ImportBaseEntryWrapper).super_PENodeWrapper.
                           super_ExeNodeWrapper.super_ExeElementWrapper.m_Exe)->
                          super_AbstractByteBuffer,(BYTE *)this_local);
      bVar2 = ImportBaseEntryWrapper::NameLenLimit;
      local_68 = bVar5;
      if (ImportBaseEntryWrapper::NameLenLimit <= bVar5) {
        local_68 = ImportBaseEntryWrapper::NameLenLimit;
      }
      bVar3 = pe_util::isStrLonger((char *)this_local,local_68);
      if ((bVar3) && (bVar2 <= bVar5)) {
        this_local = (ImportEntryWrapper *)0x0;
      }
    }
  }
  return (char *)this_local;
}

Assistant:

char* ImportEntryWrapper::getLibraryName()
{
    IMAGE_IMPORT_DESCRIPTOR* desc = (IMAGE_IMPORT_DESCRIPTOR*) getPtr();
    if (!desc) {
        return NULL;
    }

    offset_t nameRVA = desc->Name;
    offset_t nAddr = m_Exe->toRaw(nameRVA, Executable::RVA);
    if (nAddr == INVALID_ADDR) return NULL;

    //TODO: reimplement it:
    char *name = (char*) m_Exe->getContentAt(nAddr, sizeof(char));
    offset_t peSize = m_Exe->getRawSize();

    bufsize_t upperLimit = m_Exe->getMaxSizeFromPtr((BYTE*) name);
    bufsize_t HARD_LIMIT = ImportEntryWrapper::NameLenLimit;
    size_t limit = (size_t) upperLimit < HARD_LIMIT ? upperLimit : HARD_LIMIT;

    if (pe_util::isStrLonger(name, limit)) {
        if (upperLimit < HARD_LIMIT) {
            return name; // Name at the end of File. FileBuffer secures it with appended \0
        }
        return NULL;
    }
    return name;
}